

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O2

uint32_t Diligent::GetDecorationOffset(Compiler *Compiler,Resource *Res,Decoration Decoration)

{
  bool bVar1;
  char (*in_R8) [30];
  uint32_t offset;
  string msg;
  
  bVar1 = diligent_spirv_cross::Compiler::has_decoration(Compiler,(ID)(Res->id).id,Decoration);
  if (!bVar1) {
    FormatString<char[11],std::__cxx11::string,char[30]>
              (&msg,(Diligent *)"Resource \'",(char (*) [11])&Res->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\' has no requested decoration",in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetDecorationOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x65);
    std::__cxx11::string::~string((string *)&msg);
  }
  offset = 0;
  bVar1 = diligent_spirv_cross::Compiler::get_binary_offset_for_decoration
                    (Compiler,(VariableID)(Res->id).id,Decoration,&offset);
  if (!bVar1) {
    FormatString<char[37]>(&msg,(char (*) [37])"Requested decoration is not declared");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetDecorationOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x68);
    std::__cxx11::string::~string((string *)&msg);
  }
  return offset;
}

Assistant:

static uint32_t GetDecorationOffset(const diligent_spirv_cross::Compiler& Compiler,
                                    const diligent_spirv_cross::Resource& Res,
                                    spv::Decoration                       Decoration)
{
    VERIFY(Compiler.has_decoration(Res.id, Decoration), "Resource \'", Res.name, "\' has no requested decoration");
    uint32_t offset   = 0;
    auto     declared = Compiler.get_binary_offset_for_decoration(Res.id, Decoration, offset);
    VERIFY(declared, "Requested decoration is not declared");
    (void)declared;
    return offset;
}